

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCopier::InstallDirectory
          (cmFileCopier *this,char *source,char *destination,MatchProperties match_properties)

{
  cmCommand *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  unsigned_long uVar5;
  char *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  mode_t local_314;
  allocator local_2b9;
  string local_2b8 [8];
  string toPath;
  string local_290 [8];
  string fromPath;
  unsigned_long fileNum;
  unsigned_long numFiles;
  string local_258;
  Directory local_238;
  Directory dir;
  mode_t permissions_after;
  mode_t permissions_before;
  mode_t required_permissions;
  mode_t permissions;
  string local_200 [32];
  ostringstream local_1e0 [8];
  ostringstream e;
  allocator local_51;
  string local_50;
  char *local_30;
  char *destination_local;
  char *source_local;
  cmFileCopier *this_local;
  mode_t mStack_10;
  MatchProperties match_properties_local;
  
  local_30 = destination;
  destination_local = source;
  source_local = (char *)this;
  unique0x100005bd = match_properties;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,destination,&local_51);
  bVar1 = cmsys::SystemTools::FileIsDirectory(&local_50);
  (*this->_vptr_cmFileCopier[4])(this,destination,1,(ulong)((byte)~bVar1 & 1));
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar1 = cmsys::SystemTools::MakeDirectory(local_30);
  if (bVar1) {
    if (mStack_10 == 0) {
      local_314 = this->DirPermissions;
    }
    else {
      local_314 = mStack_10;
    }
    permissions_before = local_314;
    if (local_314 == 0) {
      cmsys::SystemTools::GetPermissions(destination_local,&permissions_before);
    }
    uVar2 = mode_owner_read | mode_owner_write | mode_owner_execute;
    dir.Internal._0_4_ = 0;
    if ((permissions_before & uVar2) == uVar2) {
      dir.Internal._4_4_ = permissions_before;
    }
    else {
      dir.Internal._4_4_ = permissions_before | uVar2;
      dir.Internal._0_4_ = permissions_before;
    }
    bVar1 = SetPermissions(this,local_30,dir.Internal._4_4_);
    if (bVar1) {
      cmsys::Directory::Directory(&local_238);
      pcVar6 = destination_local;
      if ((destination_local != (char *)0x0) && (*destination_local != '\0')) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_258,pcVar6,(allocator *)((long)&numFiles + 7))
        ;
        cmsys::Directory::Load(&local_238,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator((allocator<char> *)((long)&numFiles + 7));
      }
      uVar5 = cmsys::Directory::GetNumberOfFiles(&local_238);
      for (fromPath.field_2._8_8_ = 0; (ulong)fromPath.field_2._8_8_ < uVar5;
          fromPath.field_2._8_8_ = fromPath.field_2._8_8_ + 1) {
        pcVar6 = cmsys::Directory::GetFile(&local_238,fromPath.field_2._8_8_);
        iVar3 = strcmp(pcVar6,".");
        if (iVar3 != 0) {
          pcVar6 = cmsys::Directory::GetFile(&local_238,fromPath.field_2._8_8_);
          iVar3 = strcmp(pcVar6,"..");
          pcVar6 = destination_local;
          if (iVar3 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_290,pcVar6,(allocator *)(toPath.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator((allocator<char> *)(toPath.field_2._M_local_buf + 0xf))
            ;
            std::__cxx11::string::operator+=(local_290,"/");
            pcVar6 = cmsys::Directory::GetFile(&local_238,fromPath.field_2._8_8_);
            std::__cxx11::string::operator+=(local_290,pcVar6);
            pcVar6 = local_30;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2b8,pcVar6,&local_2b9);
            std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
            std::__cxx11::string::operator+=(local_2b8,"/");
            pcVar6 = cmsys::Directory::GetFile(&local_238,fromPath.field_2._8_8_);
            std::__cxx11::string::operator+=(local_2b8,pcVar6);
            uVar7 = std::__cxx11::string::c_str();
            uVar8 = std::__cxx11::string::c_str();
            uVar2 = (*this->_vptr_cmFileCopier[2])(this,uVar7,uVar8);
            bVar1 = (uVar2 & 1) == 0;
            if (bVar1) {
              match_properties_local._3_1_ = 0;
            }
            std::__cxx11::string::~string(local_2b8);
            std::__cxx11::string::~string(local_290);
            if (bVar1) goto LAB_005ca05a;
          }
        }
      }
      match_properties_local._3_1_ = SetPermissions(this,local_30,(mode_t)dir.Internal);
LAB_005ca05a:
      cmsys::Directory::~Directory(&local_238);
    }
    else {
      match_properties_local._3_1_ = 0;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    poVar4 = std::operator<<((ostream *)local_1e0,this->Name);
    poVar4 = std::operator<<(poVar4," cannot make directory \"");
    poVar4 = std::operator<<(poVar4,local_30);
    poVar4 = std::operator<<(poVar4,"\": ");
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::operator<<(poVar4,local_200);
    std::__cxx11::string::~string(local_200);
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(this_00,(string *)&required_permissions);
    std::__cxx11::string::~string((string *)&required_permissions);
    match_properties_local._3_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
  }
  return (bool)(match_properties_local._3_1_ & 1);
}

Assistant:

bool cmFileCopier::InstallDirectory(const char* source,
                                    const char* destination,
                                    MatchProperties match_properties)
{
  // Inform the user about this directory installation.
  this->ReportCopy(destination, TypeDir,
                   !cmSystemTools::FileIsDirectory(destination));

  // Make sure the destination directory exists.
  if (!cmSystemTools::MakeDirectory(destination)) {
    std::ostringstream e;
    e << this->Name << " cannot make directory \"" << destination
      << "\": " << cmSystemTools::GetLastSystemError();
    this->FileCommand->SetError(e.str());
    return false;
  }

  // Compute the requested permissions for the destination directory.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->DirPermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source directory permissions be used.
    cmSystemTools::GetPermissions(source, permissions);
  }

  // Compute the set of permissions required on this directory to
  // recursively install files and subdirectories safely.
  mode_t required_permissions =
    mode_owner_read | mode_owner_write | mode_owner_execute;

  // If the required permissions are specified it is safe to set the
  // final permissions now.  Otherwise we must add the required
  // permissions temporarily during file installation.
  mode_t permissions_before = 0;
  mode_t permissions_after = 0;
  if ((permissions & required_permissions) == required_permissions) {
    permissions_before = permissions;
  } else {
    permissions_before = permissions | required_permissions;
    permissions_after = permissions;
  }

  // Set the required permissions of the destination directory.
  if (!this->SetPermissions(destination, permissions_before)) {
    return false;
  }

  // Load the directory contents to traverse it recursively.
  cmsys::Directory dir;
  if (source && *source) {
    dir.Load(source);
  }
  unsigned long numFiles = static_cast<unsigned long>(dir.GetNumberOfFiles());
  for (unsigned long fileNum = 0; fileNum < numFiles; ++fileNum) {
    if (!(strcmp(dir.GetFile(fileNum), ".") == 0 ||
          strcmp(dir.GetFile(fileNum), "..") == 0)) {
      std::string fromPath = source;
      fromPath += "/";
      fromPath += dir.GetFile(fileNum);
      std::string toPath = destination;
      toPath += "/";
      toPath += dir.GetFile(fileNum);
      if (!this->Install(fromPath.c_str(), toPath.c_str())) {
        return false;
      }
    }
  }

  // Set the requested permissions of the destination directory.
  return this->SetPermissions(destination, permissions_after);
}